

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smd.c
# Opt level: O0

void * lws_smd_msg_alloc(lws_context *ctx,lws_smd_class_t _class,size_t len)

{
  lws_log_cx *cx;
  void *__s;
  lws_usec_t lVar1;
  lws_smd_msg_t *msg;
  size_t len_local;
  lws_smd_class_t _class_local;
  lws_context *ctx_local;
  
  if (((ctx->smd)._class_filter & _class) == 0) {
    cx = lwsl_context_get_cx(ctx);
    _lws_log_cx(cx,lws_log_prepend_context,ctx,8,"lws_smd_msg_alloc",
                "rejecting class 0x%x as no participant wants",_class);
    ctx_local = (lws_context *)0x0;
  }
  else {
    if (0x180 < len) {
      __assert_fail("len <= LWS_SMD_MAX_PAYLOAD",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/system/smd/smd.c"
                    ,0x33,"void *lws_smd_msg_alloc(struct lws_context *, lws_smd_class_t, size_t)");
    }
    __s = lws_realloc((void *)0x0,len + 0x30,"lws_smd_msg_alloc");
    if (__s == (void *)0x0) {
      ctx_local = (lws_context *)0x0;
    }
    else {
      memset(__s,0,0x30);
      lVar1 = lws_now_usecs();
      *(lws_usec_t *)((long)__s + 0x20) = lVar1;
      *(short *)((long)__s + 0x2c) = (short)len;
      *(lws_smd_class_t *)((long)__s + 0x28) = _class;
      ctx_local = (lws_context *)((long)__s + 0x30);
    }
  }
  return ctx_local;
}

Assistant:

void *
lws_smd_msg_alloc(struct lws_context *ctx, lws_smd_class_t _class, size_t len)
{
	lws_smd_msg_t *msg;

	/* only allow it if someone wants to consume this class of event */

	if (!(ctx->smd._class_filter & _class)) {
		lwsl_cx_info(ctx, "rejecting class 0x%x as no participant wants",
				(unsigned int)_class);
		return NULL;
	}

	assert(len <= LWS_SMD_MAX_PAYLOAD);


	/*
	 * If SS configured, over-allocate LWS_SMD_SS_RX_HEADER_LEN behind
	 * payload, ie,  msg_t (gap LWS_SMD_SS_RX_HEADER_LEN) payload
	 */
	msg = lws_malloc(sizeof(*msg) + LWS_SMD_SS_RX_HEADER_LEN_EFF + len,
			 __func__);
	if (!msg)
		return NULL;

	memset(msg, 0, sizeof(*msg));
	msg->timestamp = lws_now_usecs();
	msg->length = (uint16_t)len;
	msg->_class = _class;

	return ((uint8_t *)&msg[1]) + LWS_SMD_SS_RX_HEADER_LEN_EFF;
}